

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool basisu::unpack_etc1(etc_block *block,color_rgba *pDst,bool preserve_alpha)

{
  bool bVar1;
  uint32_t uVar2;
  byte in_DL;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RSI;
  etc_block *in_RDI;
  uint32_t y_5;
  uint32_t y_4;
  uint32_t y_3;
  uint32_t y_2;
  uint32_t y_1;
  uint32_t y;
  uint16_t base_color4_1;
  uint16_t base_color4_0;
  uint16_t delta_color3;
  uint16_t base_color5;
  color_rgba subblock_colors1 [4];
  color_rgba subblock_colors0 [4];
  uint32_t table_index1;
  uint32_t table_index0;
  bool flip_flag;
  bool diff_flag;
  undefined8 in_stack_ffffffffffffff08;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar3;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar4;
  etc_block *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff38;
  color_rgba *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  color_rgba *in_stack_ffffffffffffff50;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_88;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 aStack_28;
  uint32_t local_24;
  uint32_t local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_18;
  etc_block *local_10;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1a = etc_block::get_diff_bit(in_RDI);
  local_1b = etc_block::get_flip_bit(local_10);
  local_20 = etc_block::get_inten_table
                       ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                        (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  local_24 = etc_block::get_inten_table
                       ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                        (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  local_70 = local_38;
  do {
    color_rgba::color_rgba((color_rgba *)&local_70->field_1);
    local_70 = local_70 + 1;
  } while (local_70 != &aStack_28);
  local_88 = local_48;
  do {
    color_rgba::color_rgba((color_rgba *)&local_88->field_1);
    uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    local_88 = local_88 + 1;
  } while (local_88 != local_38);
  if ((local_1a & 1) == 0) {
    etc_block::get_base4_color(in_stack_ffffffffffffff20,uVar2);
    etc_block::get_abs_subblock_colors
              (in_stack_ffffffffffffff40,(uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30),
               (uint32_t)in_stack_ffffffffffffff38);
    etc_block::get_base4_color(in_stack_ffffffffffffff20,uVar2);
    etc_block::get_abs_subblock_colors
              (in_stack_ffffffffffffff40,(uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30),
               (uint32_t)in_stack_ffffffffffffff38);
  }
  else {
    etc_block::get_base5_color(in_stack_ffffffffffffff20);
    etc_block::get_delta3_color(in_stack_ffffffffffffff20);
    etc_block::get_diff_subblock_colors
              (in_stack_ffffffffffffff40,(uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30),
               (uint32_t)in_stack_ffffffffffffff38);
    bVar1 = etc_block::get_diff_subblock_colors
                      (in_stack_ffffffffffffff50,
                       (uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                       (uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffff48);
    if (!bVar1) {
      return false;
    }
  }
  if ((local_19 & 1) == 0) {
    if ((local_1b & 1) == 0) {
      for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        *local_18 = local_38[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[1] = local_38[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[2] = local_48[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[3] = local_48[uVar2];
        local_18 = local_18 + 4;
      }
    }
    else {
      for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        *local_18 = local_38[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[1] = local_38[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[2] = local_38[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[3] = local_38[uVar2];
        local_18 = local_18 + 4;
      }
      for (local_64 = 2; local_64 < 4; local_64 = local_64 + 1) {
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        *local_18 = local_48[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[1] = local_48[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[2] = local_48[uVar2];
        uVar2 = etc_block::get_selector
                          ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                           (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff08);
        local_18[3] = local_48[uVar2];
        local_18 = local_18 + 4;
      }
    }
  }
  else if ((local_1b & 1) == 0) {
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      paVar3 = local_18;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)local_18 >> 0x20),(uint32_t)local_18);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_38[uVar2].field_1);
      in_stack_ffffffffffffff10 = local_18 + 1;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)paVar3 >> 0x20),(uint32_t)paVar3);
      color_rgba::set_rgb((color_rgba *)&in_stack_ffffffffffffff10->field_1,
                          (color_rgba *)&local_38[uVar2].field_1);
      paVar4 = local_18 + 2;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)paVar3 >> 0x20),(uint32_t)paVar3);
      color_rgba::set_rgb((color_rgba *)&paVar4->field_1,(color_rgba *)&local_48[uVar2].field_1);
      paVar4 = local_18 + 3;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)paVar3 >> 0x20),(uint32_t)paVar3);
      color_rgba::set_rgb((color_rgba *)&paVar4->field_1,(color_rgba *)&local_48[uVar2].field_1);
      local_18 = local_18 + 4;
    }
  }
  else {
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      paVar3 = local_18;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_38[uVar2].field_1);
      paVar3 = local_18 + 1;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_38[uVar2].field_1);
      paVar3 = local_18 + 2;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_38[uVar2].field_1);
      paVar3 = local_18 + 3;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_38[uVar2].field_1);
      local_18 = local_18 + 4;
    }
    for (local_58 = 2; paVar3 = local_18, local_58 < 4; local_58 = local_58 + 1) {
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_48[uVar2].field_1);
      paVar3 = local_18 + 1;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_48[uVar2].field_1);
      paVar3 = local_18 + 2;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_48[uVar2].field_1);
      paVar3 = local_18 + 3;
      uVar2 = etc_block::get_selector
                        ((etc_block *)&in_stack_ffffffffffffff10->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff08);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&local_48[uVar2].field_1);
      local_18 = local_18 + 4;
    }
  }
  return true;
}

Assistant:

bool unpack_etc1(const etc_block& block, color_rgba *pDst, bool preserve_alpha)
	{
		const bool diff_flag = block.get_diff_bit();
		const bool flip_flag = block.get_flip_bit();
		const uint32_t table_index0 = block.get_inten_table(0);
		const uint32_t table_index1 = block.get_inten_table(1);

		color_rgba subblock_colors0[4];
		color_rgba subblock_colors1[4];

		if (diff_flag)
		{
			const uint16_t base_color5 = block.get_base5_color();
			const uint16_t delta_color3 = block.get_delta3_color();
			etc_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

			if (!etc_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
				return false;
		}
		else
		{
			const uint16_t base_color4_0 = block.get_base4_color(0);
			etc_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

			const uint16_t base_color4_1 = block.get_base4_color(1);
			etc_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
		}

		if (preserve_alpha)
		{
			if (flip_flag)
			{
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
			else
			{
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
		}
		else
		{
			if (flip_flag)
			{
				// 0000
				// 0000
				// 1111
				// 1111
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors0[block.get_selector(2, y)];
					pDst[3] = subblock_colors0[block.get_selector(3, y)];
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0] = subblock_colors1[block.get_selector(0, y)];
					pDst[1] = subblock_colors1[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
			else
			{
				// 0011
				// 0011
				// 0011
				// 0011
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
		}

		return true;
	}